

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::JSONParser::ParseCommand(JSONParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  bool bVar2;
  Result RVar3;
  Command *in_RAX;
  Command *pCVar4;
  Command *local_28;
  
  RVar3 = Expect(this,"{");
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  RVar3 = ExpectKey(this,"type");
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  bVar2 = Match(this,"\"module\"");
  if (bVar2) {
    pCVar4 = (Command *)operator_new(0x58);
    pCVar4->_vptr_Command = (_func_int **)0x0;
    pCVar4->type = First;
    pCVar4->line = 0;
    pCVar4[1]._vptr_Command = (_func_int **)0x0;
    pCVar4[1].type = First;
    pCVar4[1].line = 0;
    pCVar4[3]._vptr_Command = (_func_int **)0x0;
    pCVar4[3].type = First;
    pCVar4[3].line = 0;
    pCVar4[2]._vptr_Command = (_func_int **)0x0;
    pCVar4[2].type = First;
    pCVar4[2].line = 0;
    pCVar4[4]._vptr_Command = (_func_int **)0x0;
    pCVar4[4].type = First;
    pCVar4[4].line = 0;
    pCVar4[5]._vptr_Command = (_func_int **)0x0;
    pCVar4->_vptr_Command = (_func_int **)&PTR__ModuleCommand_001ff700;
    *(undefined4 *)&pCVar4[1]._vptr_Command = 1;
    *(CommandType **)&pCVar4[1].type = &pCVar4[2].type;
    *(CommandType **)&pCVar4[3].type = &pCVar4[4].type;
    RVar3 = Expect(this,",");
    if ((((RVar3.enum_ == Error) || (RVar3 = ParseLine(this,&pCVar4->line), RVar3.enum_ == Error))
        || (RVar3 = Expect(this,","), RVar3.enum_ == Error)) ||
       (RVar3 = ParseOptNameStringValue(this,(string *)&pCVar4[3].type), RVar3.enum_ == Error))
    goto LAB_0016de2b;
    RVar3 = ParseFilename(this,(string *)&pCVar4[1].type);
  }
  else {
    bVar2 = Match(this,"\"action\"");
    if (bVar2) {
      pCVar4 = (Command *)operator_new(0x88);
      pCVar4[1]._vptr_Command = (_func_int **)0x0;
      pCVar4[1].type = First;
      pCVar4[1].line = 0;
      pCVar4[3]._vptr_Command = (_func_int **)0x0;
      pCVar4[3].type = First;
      pCVar4[3].line = 0;
      pCVar4[5]._vptr_Command = (_func_int **)0x0;
      pCVar4[5].type = First;
      pCVar4[5].line = 0;
      pCVar4[2]._vptr_Command = (_func_int **)0x0;
      pCVar4[2].type = First;
      pCVar4[2].line = 0;
      pCVar4[4]._vptr_Command = (_func_int **)0x0;
      pCVar4[4].type = First;
      pCVar4[4].line = 0;
      pCVar4->type = Action;
      pCVar4->line = 0;
      pCVar4->_vptr_Command = (_func_int **)&PTR__ActionCommandBase_001ff760;
      *(CommandType **)&pCVar4[1].type = &pCVar4[2].type;
      *(CommandType **)&pCVar4[3].type = &pCVar4[4].type;
      pCVar4[6].type = First;
      pCVar4[6].line = 0;
      pCVar4[7]._vptr_Command = (_func_int **)0x0;
      pCVar4[7].type = First;
      pCVar4[7].line = 0;
      pCVar4[8]._vptr_Command = (_func_int **)0x0;
      pCVar4[5].type = First;
      pCVar4[5].line = 0;
      pCVar4[6]._vptr_Command = (_func_int **)0x0;
      RVar3 = Expect(this,",");
      if (((RVar3.enum_ == Error) || (RVar3 = ParseLine(this,&pCVar4->line), RVar3.enum_ == Error))
         || ((RVar3 = Expect(this,","), RVar3.enum_ == Error ||
             ((RVar3 = ParseAction(this,(Action *)(pCVar4 + 1)), RVar3.enum_ == Error ||
              (RVar3 = Expect(this,","), RVar3.enum_ == Error)))))) goto LAB_0016de2b;
      RVar3 = ParseActionResult(this);
    }
    else {
      bVar2 = Match(this,"\"register\"");
      if (!bVar2) {
        bVar2 = Match(this,"\"assert_malformed\"");
        if (bVar2) {
          wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)3>>();
LAB_0016deb7:
          RVar3 = Expect(this,",");
          if ((((RVar3.enum_ == Error) ||
               (RVar3 = ParseLine(this,&in_RAX->line), RVar3.enum_ == Error)) ||
              (RVar3 = Expect(this,","), RVar3.enum_ == Error)) ||
             (((RVar3 = ParseFilename(this,(string *)&in_RAX[1].type), RVar3.enum_ == Error ||
               (RVar3 = Expect(this,","), RVar3.enum_ == Error)) ||
              ((RVar3 = ParseKeyStringValue(this,"text",(string *)&in_RAX[3].type),
               RVar3.enum_ == Error || (RVar3 = Expect(this,","), RVar3.enum_ == Error))))))
          goto LAB_0016e164;
          RVar3 = ParseModuleType(this,(ModuleType *)(in_RAX + 1));
LAB_0016df79:
          if (RVar3.enum_ == Error) goto LAB_0016e164;
          local_28 = (Command *)0x0;
          pCVar4 = (out_command->_M_t).
                   super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>
                   .super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
          super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
          super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl = in_RAX;
          if (pCVar4 == (Command *)0x0) goto LAB_0016e17f;
          (*pCVar4->_vptr_Command[1])();
          bVar2 = true;
        }
        else {
          bVar2 = Match(this,"\"assert_invalid\"");
          if (bVar2) {
            wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)4>>();
            goto LAB_0016deb7;
          }
          bVar2 = Match(this,"\"assert_unlinkable\"");
          if (bVar2) {
            wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)5>>();
            goto LAB_0016deb7;
          }
          bVar2 = Match(this,"\"assert_uninstantiable\"");
          if (bVar2) {
            wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)6>>();
            goto LAB_0016deb7;
          }
          bVar2 = Match(this,"\"assert_return\"");
          if (bVar2) {
            wabt::MakeUnique<spectest::AssertReturnCommand>();
            RVar3 = Expect(this,",");
            if ((((RVar3.enum_ == Error) ||
                 (RVar3 = ParseLine(this,&in_RAX->line), RVar3.enum_ == Error)) ||
                ((RVar3 = Expect(this,","), RVar3.enum_ == Error ||
                 ((RVar3 = ParseAction(this,(Action *)(in_RAX + 1)), RVar3.enum_ == Error ||
                  (RVar3 = Expect(this,","), RVar3.enum_ == Error)))))) ||
               (RVar3 = ExpectKey(this,"expected"), RVar3.enum_ == Error)) goto LAB_0016e164;
            RVar3 = ParseExpectedValues(this,(vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                                              *)&in_RAX[8].type);
            goto LAB_0016df79;
          }
          bVar2 = Match(this,"\"assert_trap\"");
          if (bVar2) {
            wabt::MakeUnique<spectest::AssertTrapCommandBase<(wabt::CommandType)8>>();
          }
          else {
            bVar2 = Match(this,"\"assert_exhaustion\"");
            if (!bVar2) {
              PrintError(this,"unknown command type");
              return (Result)Error;
            }
            wabt::MakeUnique<spectest::AssertTrapCommandBase<(wabt::CommandType)9>>();
          }
          RVar3 = Expect(this,",");
          if (((RVar3.enum_ != Error) &&
              (RVar3 = ParseLine(this,&in_RAX->line), RVar3.enum_ != Error)) &&
             (((RVar3 = Expect(this,","), RVar3.enum_ != Error &&
               (((RVar3 = ParseAction(this,(Action *)(in_RAX + 1)), RVar3.enum_ != Error &&
                 (RVar3 = Expect(this,","), RVar3.enum_ != Error)) &&
                (RVar3 = ParseKeyStringValue(this,"text",(string *)&in_RAX[8].type),
                RVar3.enum_ != Error)))) && (RVar3 = Expect(this,","), RVar3.enum_ != Error)))) {
            RVar3 = ParseActionResult(this);
            goto LAB_0016df79;
          }
LAB_0016e164:
          bVar2 = false;
          local_28 = in_RAX;
        }
        if (local_28 != (Command *)0x0) {
          (*local_28->_vptr_Command[1])();
        }
        if (!bVar2) {
          return (Result)Error;
        }
        goto LAB_0016e17f;
      }
      pCVar4 = (Command *)operator_new(0x50);
      pCVar4[3]._vptr_Command = (_func_int **)0x0;
      pCVar4[3].type = First;
      pCVar4[3].line = 0;
      pCVar4[2]._vptr_Command = (_func_int **)0x0;
      pCVar4[2].type = First;
      pCVar4[2].line = 0;
      pCVar4[4]._vptr_Command = (_func_int **)0x0;
      pCVar4[4].type = First;
      pCVar4[4].line = 0;
      pCVar4->type = Register;
      pCVar4->line = 0;
      pCVar4->_vptr_Command = (_func_int **)&PTR__RegisterCommand_001ff7b0;
      pCVar4[1]._vptr_Command = (_func_int **)(pCVar4 + 2);
      pCVar4[1].type = First;
      pCVar4[1].line = 0;
      pCVar4[3]._vptr_Command = (_func_int **)(pCVar4 + 4);
      RVar3 = Expect(this,",");
      if ((((RVar3.enum_ == Error) || (RVar3 = ParseLine(this,&pCVar4->line), RVar3.enum_ == Error))
          || (RVar3 = Expect(this,","), RVar3.enum_ == Error)) ||
         (RVar3 = ParseOptNameStringValue(this,(string *)(pCVar4 + 3)), RVar3.enum_ == Error))
      goto LAB_0016de2b;
      RVar3 = ParseKeyStringValue(this,"as",(string *)(pCVar4 + 1));
    }
  }
  if (RVar3.enum_ == Error) {
LAB_0016de2b:
    (*pCVar4->_vptr_Command[1])(pCVar4);
    return (Result)Error;
  }
  pCVar1 = (out_command->_M_t).
           super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
           super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
           super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl;
  (out_command->_M_t).
  super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
  super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
  super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl = pCVar4;
  if (pCVar1 != (Command *)0x0) {
    (*pCVar1->_vptr_Command[1])();
  }
LAB_0016e17f:
  RVar3 = Expect(this,"}");
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

wabt::Result JSONParser::ParseCommand(CommandPtr* out_command) {
  EXPECT("{");
  EXPECT_KEY("type");
  if (Match("\"module\"")) {
    auto command = MakeUnique<ModuleCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    CHECK_RESULT(ParseFilename(&command->filename));
    *out_command = std::move(command);
  } else if (Match("\"action\"")) {
    auto command = MakeUnique<ActionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"register\"")) {
    auto command = MakeUnique<RegisterCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    PARSE_KEY_STRING_VALUE("as", &command->as);
    *out_command = std::move(command);
  } else if (Match("\"assert_malformed\"")) {
    auto command = MakeUnique<AssertMalformedCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_invalid\"")) {
    auto command = MakeUnique<AssertInvalidCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_unlinkable\"")) {
    auto command = MakeUnique<AssertUnlinkableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_uninstantiable\"")) {
    auto command = MakeUnique<AssertUninstantiableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_return\"")) {
    auto command = MakeUnique<AssertReturnCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    EXPECT_KEY("expected");
    CHECK_RESULT(ParseExpectedValues(&command->expected));
    *out_command = std::move(command);
  } else if (Match("\"assert_trap\"")) {
    auto command = MakeUnique<AssertTrapCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"assert_exhaustion\"")) {
    auto command = MakeUnique<AssertExhaustionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else {
    PrintError("unknown command type");
    return wabt::Result::Error;
  }
  EXPECT("}");
  return wabt::Result::Ok;
}